

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

lua_Alloc lua_getallocf(lua_State *L,void **ud)

{
  lua_Alloc p_Var1;
  int *piVar2;
  int iVar3;
  
  piVar2 = *(int **)&L[-1].hookmask;
  iVar3 = *piVar2;
  *piVar2 = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x607,"lua_Alloc lua_getallocf(lua_State *, void **)");
  }
  if (ud == (void **)0x0) {
    iVar3 = 0;
  }
  else {
    *ud = L->l_G->ud;
    piVar2 = *(int **)&L[-1].hookmask;
    iVar3 = *piVar2 + -1;
  }
  p_Var1 = L->l_G->frealloc;
  *piVar2 = iVar3;
  if (iVar3 == 0) {
    return p_Var1;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x60a,"lua_Alloc lua_getallocf(lua_State *, void **)");
}

Assistant:

LUA_API lua_Alloc lua_getallocf (lua_State *L, void **ud) {
  lua_Alloc f;
  lua_lock(L);
  if (ud) *ud = G(L)->ud;
  f = G(L)->frealloc;
  lua_unlock(L);
  return f;
}